

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

KeyInfo * multiSelectOrderByKeyInfo(Parse *pParse,Select *p,int nExtra)

{
  int iVar1;
  ExprList *pEVar2;
  sqlite3 *db_00;
  KeyInfo *pKVar3;
  Expr *pEVar4;
  CollSeq *local_60;
  CollSeq *pColl;
  Expr *pTerm;
  ExprList_item *pItem;
  int i;
  KeyInfo *pRet;
  sqlite3 *db;
  int nOrderBy;
  ExprList *pOrderBy;
  int nExtra_local;
  Select *p_local;
  Parse *pParse_local;
  
  pEVar2 = p->pOrderBy;
  iVar1 = p->pOrderBy->nExpr;
  db_00 = pParse->db;
  pKVar3 = sqlite3KeyInfoAlloc(db_00,iVar1 + nExtra,1);
  if (pKVar3 != (KeyInfo *)0x0) {
    for (pItem._4_4_ = 0; pItem._4_4_ < iVar1; pItem._4_4_ = pItem._4_4_ + 1) {
      pEVar4 = pEVar2->a[pItem._4_4_].pExpr;
      if ((pEVar4->flags & 0x100) == 0) {
        local_60 = multiSelectCollSeq(pParse,p,pEVar2->a[pItem._4_4_].u.x.iOrderByCol - 1);
        if (local_60 == (CollSeq *)0x0) {
          local_60 = db_00->pDfltColl;
        }
        pEVar4 = sqlite3ExprAddCollateString(pParse,pEVar4,local_60->zName);
        pEVar2->a[pItem._4_4_].pExpr = pEVar4;
      }
      else {
        local_60 = sqlite3ExprCollSeq(pParse,pEVar4);
      }
      pKVar3->aColl[pItem._4_4_] = local_60;
      pKVar3->aSortOrder[pItem._4_4_] = pEVar2->a[pItem._4_4_].sortOrder;
    }
  }
  return pKVar3;
}

Assistant:

static KeyInfo *multiSelectOrderByKeyInfo(Parse *pParse, Select *p, int nExtra){
  ExprList *pOrderBy = p->pOrderBy;
  int nOrderBy = p->pOrderBy->nExpr;
  sqlite3 *db = pParse->db;
  KeyInfo *pRet = sqlite3KeyInfoAlloc(db, nOrderBy+nExtra, 1);
  if( pRet ){
    int i;
    for(i=0; i<nOrderBy; i++){
      struct ExprList_item *pItem = &pOrderBy->a[i];
      Expr *pTerm = pItem->pExpr;
      CollSeq *pColl;

      if( pTerm->flags & EP_Collate ){
        pColl = sqlite3ExprCollSeq(pParse, pTerm);
      }else{
        pColl = multiSelectCollSeq(pParse, p, pItem->u.x.iOrderByCol-1);
        if( pColl==0 ) pColl = db->pDfltColl;
        pOrderBy->a[i].pExpr =
          sqlite3ExprAddCollateString(pParse, pTerm, pColl->zName);
      }
      assert( sqlite3KeyInfoIsWriteable(pRet) );
      pRet->aColl[i] = pColl;
      pRet->aSortOrder[i] = pOrderBy->a[i].sortOrder;
    }
  }

  return pRet;
}